

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pipe.cpp
# Opt level: O1

bool __thiscall blc::tools::pipe::push_out(pipe *this,string *target,string *str,mutex *locker)

{
  bool bVar1;
  int iVar2;
  ulong uVar3;
  
  if ((locker == (mutex *)0x0 || target == (string *)0x0) ||
     (iVar2 = (*(this->super_stream)._vptr_stream[6])(), (char)iVar2 != '\0')) {
LAB_0010dbc6:
    bVar1 = false;
  }
  else {
    if (this->_block == false) {
      iVar2 = pthread_mutex_trylock((pthread_mutex_t *)locker);
      if (iVar2 != 0) goto LAB_0010dbc6;
    }
    else {
      iVar2 = pthread_mutex_lock((pthread_mutex_t *)locker);
      if (iVar2 != 0) {
        std::__throw_system_error(iVar2);
      }
    }
    str->_M_string_length = 0;
    *(str->_M_dataplus)._M_p = '\0';
    if (target->_M_string_length != 0) {
      uVar3 = 0;
      do {
        if ((target->_M_dataplus)._M_p[uVar3] == '\n') break;
        std::__cxx11::string::resize((ulong)str,(char)str->_M_string_length + '\x01');
        (str->_M_dataplus)._M_p[uVar3] = (target->_M_dataplus)._M_p[uVar3];
        uVar3 = (ulong)((int)uVar3 + 1);
      } while (uVar3 < target->_M_string_length);
    }
    std::__cxx11::string::erase((ulong)target,0);
    pthread_mutex_unlock((pthread_mutex_t *)locker);
    bVar1 = true;
  }
  return bVar1;
}

Assistant:

bool blc::tools::pipe::push_out(std::string *target, std::string *str, std::mutex *locker) const {
	unsigned int i;

	if (target == nullptr || locker == nullptr)
		return (false);
	if (this->isClosed())
		return (false);
	if (this->_block == false) {
		if (locker->try_lock() == false)
			return (false);
	} else {
		locker->lock();
	}
	(*str).clear();
	for (i = 0; target->size() > i; i++) {
		if ((*target)[i] == '\n')
			break;
		(*str).resize((*str).size() + 1);
		(*str)[i] = (*target)[i];
	}
	target->erase(0, i + 1);
	locker->unlock();
	return (true);
}